

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgramChain.cpp
# Opt level: O1

string * __thiscall
BamTools::SamProgramChain::NextIdFor
          (string *__return_storage_ptr__,SamProgramChain *this,string *programId)

{
  SamProgram *pSVar1;
  size_t __n;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  SamProgram *this_00;
  
  this_00 = (this->m_data).
            super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (this->m_data).
           super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_00 == pSVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    bVar3 = SamProgram::HasPreviousProgramID(this_00);
    if (((!bVar3) &&
        (__n = (this_00->PreviousProgramID)._M_string_length, __n == programId->_M_string_length))
       && ((__n == 0 ||
           (iVar4 = bcmp((this_00->PreviousProgramID)._M_dataplus._M_p,(programId->_M_dataplus)._M_p
                         ,__n), iVar4 == 0)))) break;
    this_00 = this_00 + 1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (this_00->ID)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this_00->ID)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

const std::string SamProgramChain::NextIdFor(const std::string& programId) const
{

    // find first record in container whose PreviousProgramID matches @programId
    SamProgramConstIterator iter = ConstBegin();
    SamProgramConstIterator end = ConstEnd();
    for (; iter != end; ++iter) {
        const SamProgram& current = (*iter);
        if (!current.HasPreviousProgramID() && current.PreviousProgramID == programId) {
            return current.ID;
        }
    }

    // none found
    return std::string();
}